

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall SQCompilation::CheckerVisitor::isSafeAccess(CheckerVisitor *this,AccessExpr *acc)

{
  bool bVar1;
  AccessExpr *acc_00;
  CheckerVisitor *in_RSI;
  Expr *recevier;
  undefined1 local_1;
  
  bVar1 = AccessExpr::isNullable((AccessExpr *)in_RSI);
  if (bVar1) {
    local_1 = true;
  }
  else {
    acc_00 = (AccessExpr *)AccessExpr::receiver((AccessExpr *)in_RSI);
    bVar1 = Expr::isAccessExpr((Expr *)acc_00);
    if (bVar1) {
      Expr::asAccessExpr(&acc_00->super_Expr);
      local_1 = isSafeAccess(in_RSI,acc_00);
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CheckerVisitor::isSafeAccess(const AccessExpr *acc) {
  if (acc->isNullable())
    return true;

  const Expr *recevier = acc->receiver();

  if (recevier->isAccessExpr()) {
    return isSafeAccess(recevier->asAccessExpr());
  }

  return false;
}